

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O1

char * get_key_name(int key)

{
  if (key < 0x100) {
    switch(key) {
    case 0x20:
      return "SPACE";
    case 0x21:
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x3a:
    case 0x3c:
    case 0x3e:
    case 0x3f:
    case 0x40:
    case 0x5e:
    case 0x5f:
      break;
    case 0x27:
      return "APOSTROPHE";
    case 0x2c:
      return "COMMA";
    case 0x2d:
      return "MINUS";
    case 0x2e:
      return "PERIOD";
    case 0x2f:
      return "SLASH";
    case 0x30:
      return "0";
    case 0x31:
      return "1";
    case 0x32:
      return "2";
    case 0x33:
      return "3";
    case 0x34:
      return "4";
    case 0x35:
      return "5";
    case 0x36:
      return "6";
    case 0x37:
      return "7";
    case 0x38:
      return "8";
    case 0x39:
      return "9";
    case 0x3b:
      return "SEMICOLON";
    case 0x3d:
      return "EQUAL";
    case 0x41:
      return "A";
    case 0x42:
      return "B";
    case 0x43:
      return "C";
    case 0x44:
      return "D";
    case 0x45:
      return "E";
    case 0x46:
      return "F";
    case 0x47:
      return "G";
    case 0x48:
      return "H";
    case 0x49:
      return "I";
    case 0x4a:
      return "J";
    case 0x4b:
      return "K";
    case 0x4c:
      return "L";
    case 0x4d:
      return "M";
    case 0x4e:
      return "N";
    case 0x4f:
      return "O";
    case 0x50:
      return "P";
    case 0x51:
      return "Q";
    case 0x52:
      return "R";
    case 0x53:
      return "S";
    case 0x54:
      return "T";
    case 0x55:
      return "U";
    case 0x56:
      return "V";
    case 0x57:
      return "W";
    case 0x58:
      return "X";
    case 0x59:
      return "Y";
    case 0x5a:
      return "Z";
    case 0x5b:
      return "LEFT BRACKET";
    case 0x5c:
      return "BACKSLASH";
    case 0x5d:
      return "RIGHT BRACKET";
    case 0x60:
      return "GRAVE ACCENT";
    default:
      if (key == 0xa1) {
        return "WORLD 1";
      }
      if (key == 0xa2) {
        return "WORLD 2";
      }
    }
  }
  else {
    switch(key) {
    case 0x100:
      return "ESCAPE";
    case 0x101:
      return "ENTER";
    case 0x102:
      return "TAB";
    case 0x103:
      return "BACKSPACE";
    case 0x104:
      return "INSERT";
    case 0x105:
      return "DELETE";
    case 0x106:
      return "RIGHT";
    case 0x107:
      return "LEFT";
    case 0x108:
      return "DOWN";
    case 0x109:
      return "UP";
    case 0x10a:
      return "PAGE UP";
    case 0x10b:
      return "PAGE DOWN";
    case 0x10c:
      return "HOME";
    case 0x10d:
      return "END";
    case 0x118:
      return "CAPS LOCK";
    case 0x119:
      return "SCROLL LOCK";
    case 0x11a:
      return "NUM LOCK";
    case 0x11b:
      return "PRINT SCREEN";
    case 0x11c:
      return "PAUSE";
    case 0x122:
      return "F1";
    case 0x123:
      return "F2";
    case 0x124:
      return "F3";
    case 0x125:
      return "F4";
    case 0x126:
      return "F5";
    case 0x127:
      return "F6";
    case 0x128:
      return "F7";
    case 0x129:
      return "F8";
    case 0x12a:
      return "F9";
    case 299:
      return "F10";
    case 300:
      return "F11";
    case 0x12d:
      return "F12";
    case 0x12e:
      return "F13";
    case 0x12f:
      return "F14";
    case 0x130:
      return "F15";
    case 0x131:
      return "F16";
    case 0x132:
      return "F17";
    case 0x133:
      return "F18";
    case 0x134:
      return "F19";
    case 0x135:
      return "F20";
    case 0x136:
      return "F21";
    case 0x137:
      return "F22";
    case 0x138:
      return "F23";
    case 0x139:
      return "F24";
    case 0x13a:
      return "F25";
    case 0x140:
      return "KEYPAD 0";
    case 0x141:
      return "KEYPAD 1";
    case 0x142:
      return "KEYPAD 2";
    case 0x143:
      return "KEYPAD 3";
    case 0x144:
      return "KEYPAD 4";
    case 0x145:
      return "KEYPAD 5";
    case 0x146:
      return "KEYPAD 6";
    case 0x147:
      return "KEYPAD 7";
    case 0x148:
      return "KEYPAD 8";
    case 0x149:
      return "KEYPAD 9";
    case 0x14a:
      return "KEYPAD DECIMAL";
    case 0x14b:
      return "KEYPAD DIVIDE";
    case 0x14c:
      return "KEYPAD MULTIPLY";
    case 0x14d:
      return "KEYPAD SUBTRACT";
    case 0x14e:
      return "KEYPAD ADD";
    case 0x14f:
      return "KEYPAD ENTER";
    case 0x150:
      return "KEYPAD EQUAL";
    case 0x154:
      return "LEFT SHIFT";
    case 0x155:
      return "LEFT CONTROL";
    case 0x156:
      return "LEFT ALT";
    case 0x157:
      return "LEFT SUPER";
    case 0x158:
      return "RIGHT SHIFT";
    case 0x159:
      return "RIGHT CONTROL";
    case 0x15a:
      return "RIGHT ALT";
    case 0x15b:
      return "RIGHT SUPER";
    case 0x15c:
      return "MENU";
    }
  }
  return "UNKNOWN";
}

Assistant:

static const char* get_key_name(int key)
{
    switch (key)
    {
        // Printable keys
        case GLFW_KEY_A:            return "A";
        case GLFW_KEY_B:            return "B";
        case GLFW_KEY_C:            return "C";
        case GLFW_KEY_D:            return "D";
        case GLFW_KEY_E:            return "E";
        case GLFW_KEY_F:            return "F";
        case GLFW_KEY_G:            return "G";
        case GLFW_KEY_H:            return "H";
        case GLFW_KEY_I:            return "I";
        case GLFW_KEY_J:            return "J";
        case GLFW_KEY_K:            return "K";
        case GLFW_KEY_L:            return "L";
        case GLFW_KEY_M:            return "M";
        case GLFW_KEY_N:            return "N";
        case GLFW_KEY_O:            return "O";
        case GLFW_KEY_P:            return "P";
        case GLFW_KEY_Q:            return "Q";
        case GLFW_KEY_R:            return "R";
        case GLFW_KEY_S:            return "S";
        case GLFW_KEY_T:            return "T";
        case GLFW_KEY_U:            return "U";
        case GLFW_KEY_V:            return "V";
        case GLFW_KEY_W:            return "W";
        case GLFW_KEY_X:            return "X";
        case GLFW_KEY_Y:            return "Y";
        case GLFW_KEY_Z:            return "Z";
        case GLFW_KEY_1:            return "1";
        case GLFW_KEY_2:            return "2";
        case GLFW_KEY_3:            return "3";
        case GLFW_KEY_4:            return "4";
        case GLFW_KEY_5:            return "5";
        case GLFW_KEY_6:            return "6";
        case GLFW_KEY_7:            return "7";
        case GLFW_KEY_8:            return "8";
        case GLFW_KEY_9:            return "9";
        case GLFW_KEY_0:            return "0";
        case GLFW_KEY_SPACE:        return "SPACE";
        case GLFW_KEY_MINUS:        return "MINUS";
        case GLFW_KEY_EQUAL:        return "EQUAL";
        case GLFW_KEY_LEFT_BRACKET: return "LEFT BRACKET";
        case GLFW_KEY_RIGHT_BRACKET: return "RIGHT BRACKET";
        case GLFW_KEY_BACKSLASH:    return "BACKSLASH";
        case GLFW_KEY_SEMICOLON:    return "SEMICOLON";
        case GLFW_KEY_APOSTROPHE:   return "APOSTROPHE";
        case GLFW_KEY_GRAVE_ACCENT: return "GRAVE ACCENT";
        case GLFW_KEY_COMMA:        return "COMMA";
        case GLFW_KEY_PERIOD:       return "PERIOD";
        case GLFW_KEY_SLASH:        return "SLASH";
        case GLFW_KEY_WORLD_1:      return "WORLD 1";
        case GLFW_KEY_WORLD_2:      return "WORLD 2";

        // Function keys
        case GLFW_KEY_ESCAPE:       return "ESCAPE";
        case GLFW_KEY_F1:           return "F1";
        case GLFW_KEY_F2:           return "F2";
        case GLFW_KEY_F3:           return "F3";
        case GLFW_KEY_F4:           return "F4";
        case GLFW_KEY_F5:           return "F5";
        case GLFW_KEY_F6:           return "F6";
        case GLFW_KEY_F7:           return "F7";
        case GLFW_KEY_F8:           return "F8";
        case GLFW_KEY_F9:           return "F9";
        case GLFW_KEY_F10:          return "F10";
        case GLFW_KEY_F11:          return "F11";
        case GLFW_KEY_F12:          return "F12";
        case GLFW_KEY_F13:          return "F13";
        case GLFW_KEY_F14:          return "F14";
        case GLFW_KEY_F15:          return "F15";
        case GLFW_KEY_F16:          return "F16";
        case GLFW_KEY_F17:          return "F17";
        case GLFW_KEY_F18:          return "F18";
        case GLFW_KEY_F19:          return "F19";
        case GLFW_KEY_F20:          return "F20";
        case GLFW_KEY_F21:          return "F21";
        case GLFW_KEY_F22:          return "F22";
        case GLFW_KEY_F23:          return "F23";
        case GLFW_KEY_F24:          return "F24";
        case GLFW_KEY_F25:          return "F25";
        case GLFW_KEY_UP:           return "UP";
        case GLFW_KEY_DOWN:         return "DOWN";
        case GLFW_KEY_LEFT:         return "LEFT";
        case GLFW_KEY_RIGHT:        return "RIGHT";
        case GLFW_KEY_LEFT_SHIFT:   return "LEFT SHIFT";
        case GLFW_KEY_RIGHT_SHIFT:  return "RIGHT SHIFT";
        case GLFW_KEY_LEFT_CONTROL: return "LEFT CONTROL";
        case GLFW_KEY_RIGHT_CONTROL: return "RIGHT CONTROL";
        case GLFW_KEY_LEFT_ALT:     return "LEFT ALT";
        case GLFW_KEY_RIGHT_ALT:    return "RIGHT ALT";
        case GLFW_KEY_TAB:          return "TAB";
        case GLFW_KEY_ENTER:        return "ENTER";
        case GLFW_KEY_BACKSPACE:    return "BACKSPACE";
        case GLFW_KEY_INSERT:       return "INSERT";
        case GLFW_KEY_DELETE:       return "DELETE";
        case GLFW_KEY_PAGE_UP:      return "PAGE UP";
        case GLFW_KEY_PAGE_DOWN:    return "PAGE DOWN";
        case GLFW_KEY_HOME:         return "HOME";
        case GLFW_KEY_END:          return "END";
        case GLFW_KEY_KP_0:         return "KEYPAD 0";
        case GLFW_KEY_KP_1:         return "KEYPAD 1";
        case GLFW_KEY_KP_2:         return "KEYPAD 2";
        case GLFW_KEY_KP_3:         return "KEYPAD 3";
        case GLFW_KEY_KP_4:         return "KEYPAD 4";
        case GLFW_KEY_KP_5:         return "KEYPAD 5";
        case GLFW_KEY_KP_6:         return "KEYPAD 6";
        case GLFW_KEY_KP_7:         return "KEYPAD 7";
        case GLFW_KEY_KP_8:         return "KEYPAD 8";
        case GLFW_KEY_KP_9:         return "KEYPAD 9";
        case GLFW_KEY_KP_DIVIDE:    return "KEYPAD DIVIDE";
        case GLFW_KEY_KP_MULTIPLY:  return "KEYPAD MULTIPLY";
        case GLFW_KEY_KP_SUBTRACT:  return "KEYPAD SUBTRACT";
        case GLFW_KEY_KP_ADD:       return "KEYPAD ADD";
        case GLFW_KEY_KP_DECIMAL:   return "KEYPAD DECIMAL";
        case GLFW_KEY_KP_EQUAL:     return "KEYPAD EQUAL";
        case GLFW_KEY_KP_ENTER:     return "KEYPAD ENTER";
        case GLFW_KEY_PRINT_SCREEN: return "PRINT SCREEN";
        case GLFW_KEY_NUM_LOCK:     return "NUM LOCK";
        case GLFW_KEY_CAPS_LOCK:    return "CAPS LOCK";
        case GLFW_KEY_SCROLL_LOCK:  return "SCROLL LOCK";
        case GLFW_KEY_PAUSE:        return "PAUSE";
        case GLFW_KEY_LEFT_SUPER:   return "LEFT SUPER";
        case GLFW_KEY_RIGHT_SUPER:  return "RIGHT SUPER";
        case GLFW_KEY_MENU:         return "MENU";

        default:                    return "UNKNOWN";
    }
}